

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_30_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  word in_stack_00000068;
  mzd_local_t *in_stack_00000070;
  mzd_local_t *in_stack_00000078;
  
  mzd_addmul_v_s128_30_256_idx(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_30_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  mzd_addmul_v_s128_30_256_idx(c, A, CONST_BLOCK(v, 0)->w64[3] >> 34);
}